

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

db_bit * __thiscall lan::db::read_container_bit(db *this,string *content,bool in_array)

{
  bool bVar1;
  db_bit *pdVar2;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  db_bit *local_28;
  db_bit *bit;
  string *psStack_18;
  bool in_array_local;
  string *content_local;
  db *this_local;
  
  bit._7_1_ = in_array;
  psStack_18 = content;
  content_local = (string *)this;
  pdVar2 = (db_bit *)operator_new(0x50);
  db_bit::db_bit(pdVar2);
  local_28 = pdVar2;
  if ((bit._7_1_ & 1) == 0) {
    pop_next(&local_58,this,psStack_18);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  local_28->type = Container;
  pop_next(&local_78,this,psStack_18);
  bVar1 = std::operator==(&local_78,":");
  std::__cxx11::string::~string((string *)&local_78);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b8,"LANDB (pull_error): unable read container <",&local_28->key);
    std::operator+(&local_98,&local_b8,">, the param <:> was not found.");
    std::logic_error::logic_error(this_00,(string *)&local_98);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pdVar2 = get_container_data(this,psStack_18);
  local_28->lin = pdVar2;
  return local_28;
}

Assistant:

lan::db_bit * db::read_container_bit(std::string & content, bool in_array){
            db_bit * bit = new db_bit;
            if(!in_array)
                bit->key = pop_next(content);
            bit->type = Container;
            if(pop_next(content) == ":") {
                bit->lin = get_container_data(content);
            } else {
                throw lan::errors::pull_error ("LANDB (pull_error): unable read container <" + bit->key + ">, the param <:> was not found.");
            } return bit;
        }